

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O1

Space skip_whitespace(Env *env)

{
  Space SVar1;
  _Bool _Var2;
  Space SVar3;
  TSLexer *pTVar4;
  
  SVar1 = NoSpace;
  do {
    do {
      SVar3 = SVar1;
      _Var2 = skip_space(env);
      SVar1 = Indented;
    } while (_Var2);
    pTVar4 = env->lexer;
    if (((byte)(0x3400 >> ((byte)pTVar4->lookahead & 0x1f)) & (uint)pTVar4->lookahead < 0xe) != 1) {
      return SVar3;
    }
    do {
      (*pTVar4->advance)(pTVar4,true);
      pTVar4 = env->lexer;
      if (0xd < (uint)pTVar4->lookahead) break;
    } while ((0x3400U >> (pTVar4->lookahead & 0x1fU) & 1) != 0);
    SVar1 = BOL;
  } while( true );
}

Assistant:

static Space skip_whitespace(Env *env) {
  Space space = NoSpace;
  while (true) {
    if (skip_space(env)) space = Indented;
    else if (skip_newlines(env)) space = BOL;
    else return space;
  };
}